

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_per_hl.c
# Opt level: O1

ErrorNumber test_func_per_hl(TA_History *history)

{
  int optInTimePeriod;
  TA_RetCode TVar1;
  ErrorNumber EVar2;
  TA_Test_conflict8 *pTVar3;
  TA_Integer TVar4;
  TA_Integer TVar5;
  TA_Integer TVar6;
  ulong uVar7;
  ulong uVar8;
  TA_Real *pTVar9;
  TA_Real *pTVar10;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  TA_Test_conflict8 *local_48;
  TA_Real *local_40;
  TA_Real *pTStack_38;
  
  TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
  pTVar3 = tableTest;
  uVar7 = 0;
  do {
    if ((int)history->nbBars < pTVar3->expectedNbElement) {
      printf("Failed Bad Parameter for Test #%d (%d,%d)\n",uVar7 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    clearAllBuffers();
    setInputBuffer(0,history->high,history->nbBars);
    setInputBuffer(1,history->low,history->nbBars);
    switch(pTVar3->theFunction) {
    case TA_ANY_MA_TEST:
      TVar5 = pTVar3->startIdx;
      TVar4 = pTVar3->endIdx;
      TVar6 = pTVar3->optInTimePeriod;
      pTVar9 = gBuffer[1].out0;
      pTVar10 = gBuffer[0].out0;
      goto LAB_00118821;
    case TA_AD_TEST:
      TVar5 = pTVar3->startIdx;
      TVar4 = pTVar3->endIdx;
      TVar6 = pTVar3->optInTimePeriod;
      pTVar9 = gBuffer[0].out0;
      pTVar10 = gBuffer[1].out0;
LAB_00118821:
      TVar1 = TA_AROON(TVar5,TVar4,gBuffer[0].in,gBuffer[1].in,TVar6,&outBegIdx,&outNbElement,pTVar9
                       ,pTVar10);
      break;
    case TA_ADOSC_3_10_TEST:
      TVar1 = TA_AROONOSC(pTVar3->startIdx,pTVar3->endIdx,gBuffer[0].in,gBuffer[1].in,
                          pTVar3->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    case TA_ADOSC_5_2_TEST:
      TVar1 = TA_CORREL(pTVar3->startIdx,pTVar3->endIdx,gBuffer[0].in,gBuffer[1].in,
                        pTVar3->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    case TA_ACCBANDS_TEST:
      TVar1 = TA_BETA(pTVar3->startIdx,pTVar3->endIdx,gBuffer[0].in,gBuffer[1].in,
                      pTVar3->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    default:
      TVar1 = 0x140d;
    }
    EVar2 = checkDataSame(gBuffer[0].in,history->high,history->nbBars);
    if ((EVar2 != TA_TEST_PASS) ||
       (EVar2 = checkDataSame(gBuffer[1].in,history->low,history->nbBars), EVar2 != TA_TEST_PASS))
    goto LAB_00118859;
    EVar2 = checkExpectedValue(gBuffer[0].out0,TVar1,pTVar3->expectedRetCode,outBegIdx,
                               pTVar3->expectedBegIdx,outNbElement,pTVar3->expectedNbElement,
                               pTVar3->oneOfTheExpectedOutReal0,
                               pTVar3->oneOfTheExpectedOutRealIndex0);
    if (EVar2 != TA_TEST_PASS) goto LAB_001188b6;
    outNbElement = 0;
    outBegIdx = 0;
    switch(pTVar3->theFunction) {
    case TA_ANY_MA_TEST:
      TVar5 = pTVar3->startIdx;
      TVar4 = pTVar3->endIdx;
      TVar6 = pTVar3->optInTimePeriod;
      pTVar9 = gBuffer[1].out1;
      pTVar10 = gBuffer[0].in;
      goto LAB_001189aa;
    case TA_AD_TEST:
      TVar5 = pTVar3->startIdx;
      TVar4 = pTVar3->endIdx;
      TVar6 = pTVar3->optInTimePeriod;
      pTVar9 = gBuffer[0].in;
      pTVar10 = gBuffer[1].out1;
LAB_001189aa:
      TVar1 = TA_AROON(TVar5,TVar4,gBuffer[0].in,gBuffer[1].in,TVar6,&outBegIdx,&outNbElement,pTVar9
                       ,pTVar10);
      break;
    case TA_ADOSC_3_10_TEST:
      TVar1 = TA_AROONOSC(pTVar3->startIdx,pTVar3->endIdx,gBuffer[0].in,gBuffer[1].in,
                          pTVar3->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].in);
      break;
    case TA_ADOSC_5_2_TEST:
      TVar1 = TA_CORREL(pTVar3->startIdx,pTVar3->endIdx,gBuffer[0].in,gBuffer[1].in,
                        pTVar3->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].in);
      break;
    case TA_ACCBANDS_TEST:
      TVar1 = TA_BETA(pTVar3->startIdx,pTVar3->endIdx,gBuffer[0].in,gBuffer[1].in,
                      pTVar3->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].in);
      break;
    default:
      TVar1 = 0x140e;
    }
    EVar2 = checkDataSame(gBuffer[1].in,history->low,history->nbBars);
    if (((EVar2 != TA_TEST_PASS) ||
        (EVar2 = checkSameContent(gBuffer[0].out0,gBuffer[0].in), EVar2 != TA_TEST_PASS)) ||
       (EVar2 = checkSameContent(gBuffer[1].out1,gBuffer[1].out0), EVar2 != TA_TEST_PASS))
    goto LAB_00118859;
    EVar2 = checkExpectedValue(gBuffer[0].in,TVar1,pTVar3->expectedRetCode,outBegIdx,
                               pTVar3->expectedBegIdx,outNbElement,pTVar3->expectedNbElement,
                               pTVar3->oneOfTheExpectedOutReal0,
                               pTVar3->oneOfTheExpectedOutRealIndex0);
    if (EVar2 != TA_TEST_PASS) {
LAB_001188b6:
      uVar8 = (ulong)EVar2;
      printf("Fail for output id=%d\n");
      goto LAB_0011885c;
    }
    setInputBuffer(0,history->high,history->nbBars);
    setInputBuffer(1,history->low,history->nbBars);
    switch(pTVar3->theFunction) {
    case TA_ANY_MA_TEST:
      TVar5 = pTVar3->startIdx;
      TVar4 = pTVar3->endIdx;
      optInTimePeriod = pTVar3->optInTimePeriod;
      pTVar9 = gBuffer[1].out2;
      pTVar10 = gBuffer[1].in;
      goto LAB_00118b31;
    case TA_AD_TEST:
      TVar5 = pTVar3->startIdx;
      TVar4 = pTVar3->endIdx;
      optInTimePeriod = pTVar3->optInTimePeriod;
      pTVar9 = gBuffer[1].in;
      pTVar10 = gBuffer[1].out2;
LAB_00118b31:
      TA_AROON(TVar5,TVar4,gBuffer[0].in,gBuffer[1].in,optInTimePeriod,&outBegIdx,&outNbElement,
               pTVar9,pTVar10);
      break;
    case TA_ADOSC_3_10_TEST:
      TA_AROONOSC(pTVar3->startIdx,pTVar3->endIdx,gBuffer[0].in,gBuffer[1].in,
                  pTVar3->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[1].in);
      break;
    case TA_ADOSC_5_2_TEST:
      TA_CORREL(pTVar3->startIdx,pTVar3->endIdx,gBuffer[0].in,gBuffer[1].in,pTVar3->optInTimePeriod,
                &outBegIdx,&outNbElement,gBuffer[1].in);
      break;
    case TA_ACCBANDS_TEST:
      TA_BETA(pTVar3->startIdx,pTVar3->endIdx,gBuffer[0].in,gBuffer[1].in,pTVar3->optInTimePeriod,
              &outBegIdx,&outNbElement,gBuffer[1].in);
    }
    EVar2 = checkDataSame(gBuffer[0].in,history->high,history->nbBars);
    if ((EVar2 == TA_TEST_PASS) &&
       (EVar2 = checkSameContent(gBuffer[0].out0,gBuffer[1].in), EVar2 == TA_TEST_PASS)) {
      local_40 = history->high;
      pTStack_38 = history->low;
      local_48 = pTVar3;
      if ((pTVar3->doRangeTestFlag != 0) &&
         (EVar2 = doRangeTest(rangeTestFunction,TA_FUNC_UNST_NONE,&local_48,1,0),
         EVar2 != TA_TEST_PASS)) goto LAB_00118859;
      uVar8 = 0;
    }
    else {
LAB_00118859:
      uVar8 = (ulong)EVar2;
    }
LAB_0011885c:
    if ((ErrorNumber)uVar8 != TA_TEST_PASS) {
      printf("Failed Test #%d (Code=%d)\n",uVar7 & 0xffffffff,uVar8);
      return (ErrorNumber)uVar8;
    }
    uVar7 = uVar7 + 1;
    pTVar3 = pTVar3 + 1;
    if (uVar7 == 0x42) {
      TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
      return TA_TEST_PASS;
    }
  } while( true );
}

Assistant:

ErrorNumber test_func_per_hl( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   for( i=0; i < NB_TEST; i++ )
   {
      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "Failed Bad Parameter for Test #%d (%d,%d)\n",
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "Failed Test #%d (Code=%d)\n", i, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All test succeed. */
   return TA_TEST_PASS;
}